

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O1

void scm::markSchemeObject(Object *obj)

{
  ObjectTypeTag OVar1;
  Object *pOVar2;
  schemeException *this;
  long *plVar3;
  size_type *psVar4;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
LAB_0012a440:
  do {
    OVar1 = getTag(obj);
    if (TAG_EOF < OVar1) {
LAB_0012a4ab:
      this = (schemeException *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string(&local_60,*(int *)&(obj->super_Collectable).field_0x14);
      std::operator+(&local_40,"tag ",&local_60);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_80._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_80._M_dataplus._M_p == psVar4) {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80.field_2._8_8_ = plVar3[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar4;
      }
      local_80._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      schemeException::schemeException
                (this,&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/src/garbage_collection.cpp"
                 ,0x41);
      __cxa_throw(this,&schemeException::typeinfo,schemeException::~schemeException);
    }
    if (OVar1 != TAG_CONS) {
      if (OVar1 != TAG_FUNC_USER) {
        if ((0x3bdeU >> (OVar1 & 0x1f) & 1) != 0) {
          (obj->super_Collectable).marked = true;
          return;
        }
        goto LAB_0012a4ab;
      }
      pOVar2 = getUserFunctionArgList(obj);
      markSchemeObject(pOVar2);
      obj = getUserFunctionBodyList(obj);
      goto LAB_0012a440;
    }
    pOVar2 = getCar(obj);
    markSchemeObject(pOVar2);
    obj = getCdr(obj);
  } while( true );
}

Assistant:

void markSchemeObject(Object* obj)
{
  switch (getTag(obj)) {
    // in most cases, simply mark the object
    case TAG_INT:
    case TAG_FLOAT:
    case TAG_STRING:
    case TAG_SYMBOL:
    case TAG_NIL:
    case TAG_TRUE:
    case TAG_FALSE:
    case TAG_VOID:
    case TAG_EOF:
    case TAG_FUNC_BUILTIN:
    case TAG_SYNTAX:
      obj->marked = true;
      break;
    // user functions consist of two cons objects, the argument and bodylist
    case TAG_FUNC_USER:
      markSchemeObject(getUserFunctionArgList(obj));
      markSchemeObject(getUserFunctionBodyList(obj));
      break;
    // recur until we've reached the end of the list
    case TAG_CONS:
      markSchemeObject(getCar(obj));
      markSchemeObject(getCdr(obj));
      break;

    default:
      schemeThrow("tag " + std::to_string(obj->tag) + " isn't handled yet");
      break;
  }
}